

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

bool __thiscall FIX::DataDictionary::getFieldType(DataDictionary *this,int field,Type *type)

{
  const_iterator cVar1;
  key_type_conflict local_14;
  
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_FIX::TYPE::Type>,_std::_Select1st<std::pair<const_int,_FIX::TYPE::Type>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_FIX::TYPE::Type>,_std::_Select1st<std::pair<const_int,_FIX::TYPE::Type>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::TYPE::Type>_>_>
                  *)(this + 0x1c0),&local_14);
  if (cVar1._M_node != (_Base_ptr)(this + 0x1c8)) {
    *type = *(Type *)&cVar1._M_node[1].field_0x4;
  }
  return cVar1._M_node != (_Base_ptr)(this + 0x1c8);
}

Assistant:

bool getFieldType(int field, FIX::TYPE::Type &type) const {
    FieldTypes::const_iterator i = m_fieldTypes.find(field);
    if (i == m_fieldTypes.end()) {
      return false;
    }
    type = i->second;
    return true;
  }